

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O2

ImPlotColormap ImPlot::AddColormap(char *name,ImVec4 *colormap,int size,bool qual)

{
  ImPlotColormap IVar1;
  ImU32 IVar2;
  int iVar3;
  uint *puVar4;
  int i;
  ulong uVar5;
  ImPlotColormapData *this;
  ImVector<unsigned_int> buffer;
  ImVector<unsigned_int> local_48;
  char *local_38;
  
  if (size < 2) {
    __assert_fail("(size > 1) && \"The colormap size must be greater than 1!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xcf7,
                  "ImPlotColormap ImPlot::AddColormap(const char *, const ImVec4 *, int, bool)");
  }
  this = &GImPlot->ColormapData;
  IVar1 = ImPlotColormapData::GetIndex(this,name);
  if (IVar1 == -1) {
    local_48.Size = 0;
    local_48.Capacity = 0;
    local_48.Data = (ImU32 *)0x0;
    local_38 = name;
    ImVector<unsigned_int>::resize(&local_48,size);
    for (uVar5 = 0; (uint)size != uVar5; uVar5 = uVar5 + 1) {
      IVar2 = ImGui::ColorConvertFloat4ToU32(colormap);
      puVar4 = ImVector<unsigned_int>::operator[](&local_48,(int)uVar5);
      *puVar4 = IVar2;
      colormap = colormap + 1;
    }
    iVar3 = ImPlotColormapData::Append(this,local_38,local_48.Data,size,qual);
    ImVector<unsigned_int>::~ImVector(&local_48);
    return iVar3;
  }
  __assert_fail("(gp.ColormapData.GetIndex(name) == -1) && \"The colormap name has already been used!\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xcf8,"ImPlotColormap ImPlot::AddColormap(const char *, const ImVec4 *, int, bool)"
               );
}

Assistant:

ImPlotColormap AddColormap(const char* name, const ImVec4* colormap, int size, bool qual) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(size > 1, "The colormap size must be greater than 1!");
    IM_ASSERT_USER_ERROR(gp.ColormapData.GetIndex(name) == -1, "The colormap name has already been used!");
    ImVector<ImU32> buffer;
    buffer.resize(size);
    for (int i = 0; i < size; ++i)
        buffer[i] = ImGui::ColorConvertFloat4ToU32(colormap[i]);
    return gp.ColormapData.Append(name, buffer.Data, size, qual);
}